

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::
table_impl<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::rehash_impl(table_impl<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
              *this,size_t num_buckets)

{
  link_pointer prev;
  table *in_stack_00000028;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  *in_stack_00000030;
  link_pointer local_18;
  
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  ::create_buckets(in_stack_00000030,(size_t)in_stack_00000028);
  local_18 = table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
             ::get_previous_start
                       ((table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                         *)0x8da32c);
  while (local_18->next_ != (link_pointer)0x0) {
    local_18 = place_in_bucket(in_stack_00000028,(link_pointer)this);
  }
  return;
}

Assistant:

void rehash_impl(std::size_t num_buckets)
        {
            BOOST_ASSERT(this->buckets_);

            this->create_buckets(num_buckets);
            link_pointer prev = this->get_previous_start();
            while (prev->next_)
                prev = place_in_bucket(*this, prev);
        }